

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::clean_unit_string
                   (string *__return_storage_ptr__,string *propUnitString,uint32_t commodity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  pointer pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  char *pcVar12;
  size_type sVar13;
  char cVar14;
  precise_unit pVar15;
  string cString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint32_t in_stack_ffffffffffffff4c;
  string local_b0;
  long local_90;
  uint32_t local_84;
  string *local_80;
  long *local_78 [2];
  long local_68 [2];
  char *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_90 = 0;
  local_84 = commodity;
  local_80 = __return_storage_ptr__;
  do {
    pcVar12 = *(char **)((long)&clean_unit_string::powerseq._M_elems[0].
                                super__Tuple_impl<0UL,_const_char_*,_const_char_*,_int,_int>.
                                super__Head_base<0UL,_const_char_*,_false>._M_head_impl + local_90);
    strlen(pcVar12);
    uVar7 = std::__cxx11::string::find((char *)propUnitString,(ulong)pcVar12,0);
    if (uVar7 != 0xffffffffffffffff) {
      local_58 = (char *)(long)*(int *)((long)&clean_unit_string::powerseq._M_elems[0].
                                               super__Tuple_impl<0UL,_const_char_*,_const_char_*,_int,_int>
                                               .super__Tuple_impl<1UL,_const_char_*,_int,_int>.
                                               super__Tuple_impl<2UL,_int,_int>.
                                               super__Head_base<2UL,_int,_false>._M_head_impl +
                                       local_90);
      __s = *(char **)((long)&clean_unit_string::powerseq._M_elems[0].
                              super__Tuple_impl<0UL,_const_char_*,_const_char_*,_int,_int>.
                              super__Tuple_impl<1UL,_const_char_*,_int,_int>.
                              super__Head_base<1UL,_const_char_*,_false>._M_head_impl + local_90);
      do {
        strlen(__s);
        std::__cxx11::string::replace((ulong)propUnitString,uVar7,local_58,(ulong)__s);
        iVar6 = *(int *)((long)&clean_unit_string::powerseq._M_elems[0].
                                super__Tuple_impl<0UL,_const_char_*,_const_char_*,_int,_int>.
                                super__Tuple_impl<1UL,_const_char_*,_int,_int>.
                                super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
                                super__Head_base<3UL,_int,_false>._M_head_impl + local_90);
        strlen(pcVar12);
        uVar7 = std::__cxx11::string::find
                          ((char *)propUnitString,(ulong)pcVar12,(long)iVar6 + uVar7);
      } while (uVar7 != 0xffffffffffffffff);
    }
    uVar5 = local_84;
    local_90 = local_90 + 0x18;
  } while (local_90 != 0x108);
  cVar14 = (char)propUnitString;
  if (propUnitString->_M_string_length != 0) {
    pcVar12 = (propUnitString->_M_dataplus)._M_p;
    if ((*pcVar12 == '(') && (pcVar12[propUnitString->_M_string_length - 1] == ')')) {
      lVar8 = std::__cxx11::string::find(cVar14,0x28);
      if (lVar8 == -1) {
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_erase((ulong)propUnitString,0);
      }
    }
    lVar8 = std::__cxx11::string::find((char *)propUnitString,0x19f803,0);
    if (lVar8 != -1) {
      reduce_number_length(propUnitString,'0');
    }
    lVar8 = std::__cxx11::string::find((char *)propUnitString,0x19f4c7,0);
    if (lVar8 != -1) {
      reduce_number_length(propUnitString,'9');
    }
  }
  if (uVar5 == 0) {
    pcVar12 = (propUnitString->_M_dataplus)._M_p;
    sVar13 = propUnitString->_M_string_length;
    if ((sVar13 != 0) && (9 < (byte)(*pcVar12 - 0x30U))) {
      (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
      paVar1 = &propUnitString->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar12 == paVar1) {
        uVar3 = *(undefined8 *)((long)&propUnitString->field_2 + 8);
        (local_80->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(undefined8 *)((long)&local_80->field_2 + 8) = uVar3;
      }
      else {
        (local_80->_M_dataplus)._M_p = pcVar12;
        (local_80->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      goto LAB_0017e1e6;
    }
  }
  else {
    getCommodityName_abi_cxx11_(in_stack_ffffffffffffff4c);
    iVar6 = std::__cxx11::string::compare((ulong)&local_b0,0,(char *)0x7);
    if (iVar6 != 0) {
      uVar7 = 0;
      do {
        uVar7 = std::__cxx11::string::find_first_of((char *)&local_b0,0x19f513,uVar7);
        if (uVar7 == 0) {
LAB_0017de0d:
          std::__cxx11::string::insert((ulong)&local_b0,uVar7,'\x01');
          uVar7 = uVar7 + 1;
        }
        else {
          if (uVar7 == 0xffffffffffffffff) break;
          if (local_b0._M_dataplus._M_p[uVar7 - 1] != '\\') goto LAB_0017de0d;
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
    std::__cxx11::string::_M_replace_aux((ulong)&local_b0,0,0,'\x01');
    std::__cxx11::string::push_back((char)&local_b0);
    if ((int)uVar5 < 0) {
      uVar7 = std::__cxx11::string::rfind(cVar14,0x2f);
      if (uVar7 == 0xffffffffffffffff) {
        pVar15 = checkForCustomUnit(&local_b0);
        if (pVar15.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar15.multiplier_)) {
          std::__cxx11::string::insert((ulong)&local_b0,0,'\x01');
        }
        if (propUnitString->_M_string_length == 0) {
          std::__cxx11::string::push_back(cVar14);
        }
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::_M_append((char *)propUnitString,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
        uVar10 = std::__cxx11::string::find_last_of
                           ((char *)propUnitString,0x19f4d9,0xffffffffffffffff);
        if (uVar10 == 0xffffffffffffffff || uVar10 < uVar7) {
          std::__cxx11::string::_M_append((char *)propUnitString,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::replace
                    ((ulong)propUnitString,uVar10,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
        }
      }
    }
    else {
      lVar8 = std::__cxx11::string::find_last_of((char *)propUnitString,0x1a3e77,0xffffffffffffffff)
      ;
      if (lVar8 == -1) {
        std::__cxx11::string::_M_append((char *)propUnitString,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
        iVar6 = std::__cxx11::string::compare((ulong)propUnitString,0,(char *)0x2);
        if (iVar6 == 0) {
          pVar15 = checkForCustomUnit(&local_b0);
          if (pVar15.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar15.multiplier_)) {
            std::__cxx11::string::insert((ulong)&local_b0,0,'\x01');
          }
          _Var4._M_p = local_b0._M_dataplus._M_p;
          strlen(local_b0._M_dataplus._M_p);
          std::__cxx11::string::replace((ulong)propUnitString,0,(char *)0x1,(ulong)_Var4._M_p);
        }
        else {
          uVar7 = std::__cxx11::string::find_first_of((char *)propUnitString,0x19f4d5,0);
          pcVar2 = (propUnitString->_M_dataplus)._M_p;
          if ((pcVar2[uVar7] == '^') && (pcVar2[uVar7 + 1] == '-')) {
            pVar15 = checkForCustomUnit(&local_b0);
            if (pVar15.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar15.multiplier_)) {
              std::__cxx11::string::insert((ulong)&local_b0,0,'\x01');
            }
            local_78[0] = local_68;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,local_b0._M_dataplus._M_p,
                       local_b0._M_dataplus._M_p + local_b0._M_string_length);
            std::__cxx11::string::append((char *)local_78);
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_78,(ulong)(propUnitString->_M_dataplus)._M_p);
            plVar11 = plVar9 + 2;
            if ((long *)*plVar9 == plVar11) {
              local_40 = *plVar11;
              lStack_38 = plVar9[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *plVar11;
              local_50 = (long *)*plVar9;
            }
            local_48 = plVar9[1];
            *plVar9 = (long)plVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)propUnitString,(string *)&local_50);
            if (local_50 != &local_40) {
              operator_delete(local_50,local_40 + 1);
            }
            if (local_78[0] != local_68) {
              operator_delete(local_78[0],local_68[0] + 1);
            }
          }
          else {
            std::__cxx11::string::replace
                      ((ulong)propUnitString,uVar7,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = (propUnitString->_M_dataplus)._M_p;
  }
  (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
  paVar1 = &propUnitString->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar12 == paVar1) {
    uVar3 = *(undefined8 *)((long)&propUnitString->field_2 + 8);
    (local_80->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_80->field_2 + 8) = uVar3;
  }
  else {
    (local_80->_M_dataplus)._M_p = pcVar12;
    (local_80->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  sVar13 = propUnitString->_M_string_length;
LAB_0017e1e6:
  local_80->_M_string_length = sVar13;
  (propUnitString->_M_dataplus)._M_p = (pointer)&propUnitString->field_2;
  propUnitString->_M_string_length = 0;
  (propUnitString->field_2)._M_local_buf[0] = '\0';
  return (string *)&propUnitString->field_2;
}

Assistant:

static std::string
    clean_unit_string(std::string propUnitString, std::uint32_t commodity)
{
    using spair = std::tuple<const char*, const char*, int, int>;
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<spair, 11> powerseq{
        {spair{"Mm^3", "(1e9km^3)", 4, 8},  // this needs to happen before ^3^2
                                            // conversions
         spair{"^2^2", "^4", 4, 2},
         spair{"^3^2", "^6", 4, 2},
         spair{"^2^3", "^6", 4, 2},
         spair{"^3^3", "^9", 4, 2},  // this can only happen with extended units
         spair{"Gs", "Bs", 2, 2},
         spair{"*K^", "*1*K^", 3, 5},  // this one is to prevent the next from
                                       // screwing things up
         spair{"eflag*K", "degC", 7, 4},
         spair{"*1*", "*", 3, 1},
         spair{"*1/", "/", 3, 1},
         spair{"*/", "/", 2, 1}}};
    // run a few checks for unusual conditions
    for (const auto& pseq : powerseq) {
        auto fnd = propUnitString.find(std::get<0>(pseq));
        while (fnd != std::string::npos) {
            propUnitString.replace(fnd, std::get<2>(pseq), std::get<1>(pseq));
            fnd =
                propUnitString.find(std::get<0>(pseq), fnd + std::get<3>(pseq));
        }
    }

    if (!propUnitString.empty()) {
        if (propUnitString.front() == '(' && propUnitString.back() == ')') {
            if (propUnitString.find_first_of('(', 1) == std::string::npos) {
                propUnitString.pop_back();
                propUnitString.erase(propUnitString.begin());
            }
        }
        if (propUnitString.find("00000") != std::string::npos) {
            reduce_number_length(propUnitString, '0');
        }
        if (propUnitString.find("99999") != std::string::npos) {
            reduce_number_length(propUnitString, '9');
        }
    }

    // no more cleaning necessary
    if (commodity == 0 && !propUnitString.empty() &&
        !isDigitCharacter(propUnitString.front())) {
        return propUnitString;
    }

    if (commodity != 0) {
        std::string cString = getCommodityName(
            ((commodity & 0x80000000) == 0) ? commodity : (~commodity));
        if (cString.compare(0, 7, "CXCOMM[") != 0) {
            // add some escapes for problematic sequences
            escapeString(cString);
        }
        // make it look like a commodity sequence
        cString.insert(cString.begin(), '{');
        cString.push_back('}');
        if ((commodity & 0x80000000) == 0) {
            auto loc = propUnitString.find_last_of("/^");
            if (loc == std::string::npos) {
                propUnitString += cString;
            } else if (propUnitString.compare(0, 2, "1/") == 0) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {
                    cString.insert(0, 1, '1');
                }
                propUnitString.replace(0, 1, cString.c_str());
            } else {
                auto locp = propUnitString.find_first_of("^*/");
                if (propUnitString[locp] != '^' ||
                    propUnitString[locp + 1] != '-') {
                    propUnitString.insert(locp, cString);
                } else {
                    auto rs = checkForCustomUnit(cString);
                    if (!is_error(rs)) {
                        // this condition would take a very particular and odd
                        // string to trigger I haven't figured out a test case
                        // for it yet

                        // LCOV_EXCL_START
                        cString.insert(0, 1, '1');
                        // LCOV_EXCL_STOP
                    }
                    propUnitString = cString + "*" + propUnitString;
                }
            }
        } else {  // inverse commodity
            auto loc = propUnitString.find_last_of('/');
            if (loc == std::string::npos) {
                auto rs = checkForCustomUnit(cString);
                if (!is_error(rs)) {  // this check is needed because it is
                                      // possible to define a commodity that
                                      // would look like a form
                    // of custom unit
                    // The '1' forces the interpreter to interpret it as purely
                    // a commodity, but is only needed in very particular
                    // circumstances
                    cString.insert(0, 1, '1');
                }
                if (propUnitString.empty()) {
                    propUnitString.push_back('1');
                }
                propUnitString.push_back('/');
                propUnitString.append(cString);
            } else {
                auto locp = propUnitString.find_last_of("^*");
                if (locp == std::string::npos || locp < loc) {
                    propUnitString.append(cString);
                } else {
                    propUnitString.insert(locp, cString);
                }
            }
        }
    }
    return propUnitString;
}